

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

BufferHandle * __thiscall
duckdb::StandardBufferManager::Allocate
          (BufferHandle *__return_storage_ptr__,StandardBufferManager *this,MemoryTag tag,
          BlockManager *block_manager,bool can_destroy)

{
  undefined7 in_register_00000011;
  shared_ptr<duckdb::BlockHandle,_true> block;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  AllocateMemory((StandardBufferManager *)&stack0xffffffffffffffd8,(MemoryTag)this,
                 (BlockManager *)CONCAT71(in_register_00000011,tag),SUB81(block_manager,0));
  Pin(__return_storage_ptr__,this,(shared_ptr<duckdb::BlockHandle,_true> *)&stack0xffffffffffffffd8)
  ;
  if ((DatabaseInstance *)local_20._M_pi != (DatabaseInstance *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

BufferHandle StandardBufferManager::Allocate(MemoryTag tag, BlockManager *block_manager, bool can_destroy) {
	auto block = AllocateMemory(tag, block_manager, can_destroy);

#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	// Initialize the memory with garbage data
	WriteGarbageIntoBuffer(*block);
#endif
	return Pin(block);
}